

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool wildcard_match(char *wildcard,char *target)

{
  int iVar1;
  char *in_RDI;
  _Bool local_1;
  
  iVar1 = strcmp(in_RDI,"*");
  if (iVar1 == 0) {
    local_1 = true;
  }
  else {
    local_1 = wildcard_match_rec(wildcard,target);
  }
  return local_1;
}

Assistant:

bool wildcard_match(const char *wildcard, const char *target)
{
#if (defined(_WIN32) && !defined(__CYGWIN__))
	if (strcmp(wildcard, "*.*") == 0)
	{
		return true;
	}
#endif
	if (strcmp(wildcard, "*") == 0)
	{
		return true;
	}
	else
	{
		return wildcard_match_rec(wildcard, target);
	}
}